

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O0

vector<despot::State_*,_std::allocator<despot::State_*>_> *
despot::ParticleBelief::Resample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,int num
          ,DSPOMDP *model,StateIndexer *indexer,ACT_TYPE action,OBS_TYPE obs)

{
  uint uVar1;
  int iVar2;
  log_ostream *plVar3;
  ostream *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  State *extraout_XMM0_Qa;
  value_type local_68;
  State *particle;
  double prob;
  State *state;
  uint local_40;
  undefined1 local_39;
  int s;
  OBS_TYPE obs_local;
  StateIndexer *pSStack_28;
  ACT_TYPE action_local;
  StateIndexer *indexer_local;
  DSPOMDP *model_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *pvStack_10;
  int num_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *sample;
  
  _s = obs;
  obs_local._4_4_ = action;
  pSStack_28 = indexer;
  indexer_local = (StateIndexer *)model;
  model_local._4_4_ = num;
  pvStack_10 = __return_storage_ptr__;
  if (indexer != (StateIndexer *)0x0) {
    local_39 = 0;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(__return_storage_ptr__);
    for (local_40 = 0; uVar1 = local_40, iVar2 = (*pSStack_28->_vptr_StateIndexer[2])(),
        (int)uVar1 < iVar2; local_40 = local_40 + 1) {
      iVar2 = (*pSStack_28->_vptr_StateIndexer[4])(pSStack_28,(ulong)local_40);
      prob = (double)CONCAT44(extraout_var,iVar2);
      (*indexer_local->_vptr_StateIndexer[7])(indexer_local,_s,prob,(ulong)obs_local._4_4_);
      if (0.0 < (double)extraout_XMM0_Qa) {
        particle = extraout_XMM0_Qa;
        iVar2 = (*indexer_local->_vptr_StateIndexer[0x16])(indexer_local,prob);
        local_68 = (value_type)CONCAT44(extraout_var_00,iVar2);
        local_68->weight = (double)particle;
        std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                  (__return_storage_ptr__,&local_68);
      }
    }
    return __return_storage_ptr__;
  }
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 0 < iVar2)) {
    plVar3 = logging::stream(1);
    this = std::operator<<(&plVar3->super_ostream,"[Belief::Resample] indexer cannot be null");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  exit(1);
}

Assistant:

vector<State*> ParticleBelief::Resample(int num, const DSPOMDP* model,
	const StateIndexer* indexer, ACT_TYPE action, OBS_TYPE obs) {
	if (indexer == NULL) {
		loge << "[Belief::Resample] indexer cannot be null" << endl;
		exit(1);
	}

	vector<State*> sample;

	for (int s = 0; s < indexer->NumStates(); s++) {
		const State* state = indexer->GetState(s);
		double prob = model->ObsProb(obs, *state, action);
		if (prob > 0) {
			State* particle = model->Copy(state);
			particle->weight = prob;
			sample.push_back(particle);
		}
	}

	return sample;
}